

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_image_ccitt.c
# Opt level: O0

HPDF_STATUS
HPDF_Stream_CcittToStream
          (HPDF_BYTE *buf,HPDF_Stream dst,HPDF_Encrypt e,HPDF_UINT width,HPDF_UINT height,
          HPDF_UINT line_width,HPDF_BOOL top_is_first)

{
  int iVar1;
  HPDF_STATUS HVar2;
  ulong uVar3;
  undefined1 local_78 [8];
  _HPDF_CCITT_Data data;
  HPDF_BYTE *pHStack_48;
  int lineIncrement;
  HPDF_BYTE *pBufEnd;
  HPDF_BYTE *pBufPos;
  HPDF_UINT line_width_local;
  HPDF_UINT height_local;
  HPDF_UINT width_local;
  HPDF_Encrypt e_local;
  HPDF_Stream dst_local;
  HPDF_BYTE *buf_local;
  
  if (height == 0) {
    buf_local = (HPDF_BYTE *)0x1;
  }
  else {
    if (top_is_first == 0) {
      pBufEnd = buf + line_width * (height - 1);
      uVar3 = -(ulong)line_width;
      data.tif_rawdata._4_4_ = -line_width;
    }
    else {
      uVar3 = (ulong)(line_width * height);
      data.tif_rawdata._4_4_ = line_width;
      pBufEnd = buf;
    }
    pHStack_48 = buf + uVar3;
    memset(local_78,0,0x28);
    data.tif_data = (HPDF_Fax3CodecState *)dst;
    data._16_8_ = malloc(0x4000);
    data.dst._0_4_ = 0x4000;
    data.dst._4_4_ = 0;
    data.tif_rawcp = (tidata_t)data._16_8_;
    HVar2 = HPDF_InitCCITTFax3((_HPDF_CCITT_Data *)local_78);
    if (HVar2 == 0) {
      iVar1 = HPDF_Fax3SetupState((_HPDF_CCITT_Data *)local_78,width,height,line_width);
      if (iVar1 == 0) {
        HVar2 = HPDF_Fax3PreEncode((_HPDF_CCITT_Data *)local_78);
        if (HVar2 == 0) {
          for (; pHStack_48 != pBufEnd; pBufEnd = pBufEnd + (int)data.tif_rawdata._4_4_) {
            HPDF_Fax4Encode((_HPDF_CCITT_Data *)local_78,pBufEnd,line_width);
          }
          HPDF_Fax4PostEncode((_HPDF_CCITT_Data *)local_78);
          HPDF_FreeCCITTFax3((_HPDF_CCITT_Data *)local_78);
          buf_local = (HPDF_BYTE *)0x0;
        }
        else {
          HPDF_FreeCCITTFax3((_HPDF_CCITT_Data *)local_78);
          buf_local = (HPDF_BYTE *)0x1;
        }
      }
      else {
        HPDF_FreeCCITTFax3((_HPDF_CCITT_Data *)local_78);
        buf_local = (HPDF_BYTE *)0x1;
      }
    }
    else {
      buf_local = (HPDF_BYTE *)0x1;
    }
  }
  return (HPDF_STATUS)buf_local;
}

Assistant:

HPDF_STATUS 
HPDF_Stream_CcittToStream( const HPDF_BYTE   *buf,
                            HPDF_Stream  dst,
							HPDF_Encrypt  e,
							HPDF_UINT          width,
							HPDF_UINT          height,
							HPDF_UINT          line_width,
							HPDF_BOOL		   top_is_first)
{
	const HPDF_BYTE   *pBufPos;
	const HPDF_BYTE   *pBufEnd; /* end marker */
	int lineIncrement;
	struct _HPDF_CCITT_Data data;

	HPDF_UNUSED (e);

	if(height==0) return 1;
	if(top_is_first) {
		pBufPos = buf;
		pBufEnd=buf+(line_width*height);
		lineIncrement = line_width;
	} else {
		pBufPos = buf+(line_width*(height-1));
		pBufEnd= buf-line_width;
		lineIncrement = -((int)line_width);
	}	

	memset(&data, 0, sizeof(struct _HPDF_CCITT_Data));
	data.dst = dst;
	data.tif_rawdata = (tidata_t) malloc( 16384 ); /*  16 kb buffer */
	data.tif_rawdatasize = 16384;
	data.tif_rawcc = 0;
	data.tif_rawcp = data.tif_rawdata;

	if(HPDF_InitCCITTFax3(&data)!=HPDF_OK)
		return 1;

	if(HPDF_Fax3SetupState(&data, width, height, line_width)!=HPDF_OK)
	{
		HPDF_FreeCCITTFax3(&data);
		return 1;
	}

	if(HPDF_Fax3PreEncode(&data)!=HPDF_OK)
	{
		HPDF_FreeCCITTFax3(&data);
		return 1;
	}

	/*  encode data */
	while(pBufEnd!=pBufPos)
	{
		HPDF_Fax4Encode(&data, (tidata_t)pBufPos, line_width);
		pBufPos+=lineIncrement;
	}

	HPDF_Fax4PostEncode(&data);

	HPDF_FreeCCITTFax3(&data);

	return HPDF_OK;
}